

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O1

char * __thiscall
CVmObjStringBuffer::substr_to_string
          (CVmObjStringBuffer *this,vm_val_t *new_str,int32_t idx,int32_t len)

{
  CVmObjPageEntry *pCVar1;
  int *piVar2;
  vm_obj_id_t vVar3;
  vm_strbuf_ext *ext;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  size_t src_count;
  utf8_ptr p;
  utf8_ptr local_30;
  
  piVar2 = (int *)(this->super_CVmObject).ext_;
  if (idx < 0) {
    idx = 0;
  }
  else if (*piVar2 < idx) {
    idx = *piVar2;
  }
  if (len < 0) {
    src_count = 0;
  }
  else {
    iVar6 = *piVar2 - idx;
    if (idx + len <= *piVar2) {
      iVar6 = len;
    }
    src_count = (size_t)iVar6;
  }
  local_30.p_ = (char *)0x0;
  sVar4 = utf8_ptr::setwchars(&local_30,piVar2 + (long)idx + 3,src_count,0);
  vVar3 = CVmObjString::create(0,(long)(int)sVar4);
  new_str->typ = VM_OBJ;
  (new_str->val).obj = vVar3;
  pCVar1 = G_obj_table_X.pages_[vVar3 >> 0xc] + (vVar3 & 0xfff);
  local_30.p_ = (char *)(*(long *)((long)&pCVar1->ptr_ + 8) + 2);
  utf8_ptr::setwchars(&local_30,piVar2 + (long)idx + 3,src_count,(long)(int)sVar4);
  pcVar5 = (char *)(**(code **)(*(long *)&pCVar1->ptr_ + 0x1a8))(pCVar1);
  return pcVar5;
}

Assistant:

const char *CVmObjStringBuffer::substr_to_string(
    VMG_ vm_val_t *new_str, int32_t idx, int32_t len) const
{
    vm_strbuf_ext *ext = get_ext();

    /* keep the arguments within our limits */
    adjust_args(&idx, &len, 0);

    /* calculate the size in bytes of the UTF-8 version of the string */
    utf8_ptr p;
    int32_t bytelen = p.setwchars(ext->buf + idx, len, 0);

    /* allocate a string */
    new_str->set_obj(CVmObjString::create(vmg_ FALSE, bytelen));
    CVmObjString *str = (CVmObjString *)vm_objp(vmg_ new_str->val.obj);

    /* translate the string to UTF-8 into the buffer */
    p.set(str->cons_get_buf());
    p.setwchars(ext->buf + idx, len, bytelen);

    /* return the new string buffer */
    return str->get_as_string(vmg0_);
}